

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int skip_tpl_for_frame(GF_GROUP *gf_group,int frame_idx,int gop_eval,int approx_gop_eval,
                      int reduce_num_frames)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x5f;
  if (gf_group->size < 0x5f) {
    iVar2 = gf_group->size;
  }
  iVar1 = 1;
  if ((((gf_group->update_type[frame_idx] & 0xfe) != 4) &&
      ((approx_gop_eval == 0 ||
       (frame_idx < iVar2 && gf_group->layer_depth[frame_idx] <= (int)(gop_eval == 2 | 2))))) &&
     ((reduce_num_frames == 0 || (gf_group->update_type[frame_idx] != 1 || iVar2 <= frame_idx)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static inline int skip_tpl_for_frame(const GF_GROUP *gf_group, int frame_idx,
                                     int gop_eval, int approx_gop_eval,
                                     int reduce_num_frames) {
  // When gop_eval is set to 2, tpl stats calculation is done for ARFs from base
  // layer, (base+1) layer and (base+2) layer. When gop_eval is set to 3,
  // tpl stats calculation is limited to ARFs from base layer and (base+1)
  // layer.
  const int num_arf_layers = (gop_eval == 2) ? 3 : 2;
  const int gop_length = get_gop_length(gf_group);

  if (gf_group->update_type[frame_idx] == INTNL_OVERLAY_UPDATE ||
      gf_group->update_type[frame_idx] == OVERLAY_UPDATE)
    return 1;

  // When approx_gop_eval = 1, skip tpl stats calculation for higher layer
  // frames and for frames beyond gop length.
  if (approx_gop_eval && (gf_group->layer_depth[frame_idx] > num_arf_layers ||
                          frame_idx >= gop_length))
    return 1;

  if (reduce_num_frames && gf_group->update_type[frame_idx] == LF_UPDATE &&
      frame_idx < gop_length)
    return 1;

  return 0;
}